

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacros
          (string *out,MacroExpanderVector *macroExpanders,int version)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  ExpandMacroResult e;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a8;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  undefined1 local_88 [4];
  State state;
  string macroName;
  string macroNamespace;
  string result;
  int version_local;
  MacroExpanderVector *macroExpanders_local;
  string *out_local;
  
  std::__cxx11::string::string((string *)(macroNamespace.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(macroName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_88);
  __range1._4_4_ = 0;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_a8._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff58), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (__range1._4_4_ == 0) {
      if (cVar1 == '$') {
        __range1._4_4_ = 1;
      }
      else {
        std::__cxx11::string::operator+=((string *)(macroNamespace.field_2._M_local_buf + 8),cVar1);
      }
    }
    else if (__range1._4_4_ == 1) {
      if (cVar1 == '{') {
        bVar2 = anon_unknown.dwarf_17b041::IsValidMacroNamespace
                          ((string *)((long)&macroName.field_2 + 8));
        if (bVar2) {
          __range1._4_4_ = 2;
        }
        else {
          std::__cxx11::string::operator+=((string *)(macroNamespace.field_2._M_local_buf + 8),'$');
          std::__cxx11::string::operator+=
                    ((string *)(macroNamespace.field_2._M_local_buf + 8),
                     (string *)(macroName.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)(macroNamespace.field_2._M_local_buf + 8),'{');
          std::__cxx11::string::clear();
          __range1._4_4_ = 0;
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)(macroName.field_2._M_local_buf + 8),cVar1);
        bVar2 = anon_unknown.dwarf_17b041::PrefixesValidMacroNamespace
                          ((string *)((long)&macroName.field_2 + 8));
        if (!bVar2) {
          std::__cxx11::string::operator+=((string *)(macroNamespace.field_2._M_local_buf + 8),'$');
          std::__cxx11::string::operator+=
                    ((string *)(macroNamespace.field_2._M_local_buf + 8),
                     (string *)(macroName.field_2._M_local_buf + 8));
          std::__cxx11::string::clear();
          __range1._4_4_ = 0;
        }
      }
    }
    else if (__range1._4_4_ == 2) {
      if (cVar1 == '}') {
        out_local._4_4_ =
             ExpandMacro((string *)((long)&macroNamespace.field_2 + 8),
                         (string *)((long)&macroName.field_2 + 8),(string *)local_88,macroExpanders,
                         version);
        if (out_local._4_4_ != Ok) goto LAB_00240814;
        std::__cxx11::string::clear();
        std::__cxx11::string::clear();
        __range1._4_4_ = 0;
      }
      else {
        std::__cxx11::string::operator+=((string *)local_88,cVar1);
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  if (__range1._4_4_ != 0) {
    if (__range1._4_4_ == 1) {
      std::__cxx11::string::operator+=((string *)(macroNamespace.field_2._M_local_buf + 8),'$');
      std::__cxx11::string::operator+=
                ((string *)(macroNamespace.field_2._M_local_buf + 8),
                 (string *)(macroName.field_2._M_local_buf + 8));
    }
    else if (__range1._4_4_ == 2) {
      out_local._4_4_ = Error;
      goto LAB_00240814;
    }
  }
  std::__cxx11::string::operator=((string *)out,(string *)(macroNamespace.field_2._M_local_buf + 8))
  ;
  out_local._4_4_ = Ok;
LAB_00240814:
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(macroName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(macroNamespace.field_2._M_local_buf + 8));
  return out_local._4_4_;
}

Assistant:

ExpandMacroResult cmCMakePresetsGraphInternal::ExpandMacros(
  std::string& out, MacroExpanderVector const& macroExpanders, int version)
{
  std::string result;
  std::string macroNamespace;
  std::string macroName;

  enum class State
  {
    Default,
    MacroNamespace,
    MacroName,
  } state = State::Default;

  for (auto c : out) {
    switch (state) {
      case State::Default:
        if (c == '$') {
          state = State::MacroNamespace;
        } else {
          result += c;
        }
        break;

      case State::MacroNamespace:
        if (c == '{') {
          if (IsValidMacroNamespace(macroNamespace)) {
            state = State::MacroName;
          } else {
            result += '$';
            result += macroNamespace;
            result += '{';
            macroNamespace.clear();
            state = State::Default;
          }
        } else {
          macroNamespace += c;
          if (!PrefixesValidMacroNamespace(macroNamespace)) {
            result += '$';
            result += macroNamespace;
            macroNamespace.clear();
            state = State::Default;
          }
        }
        break;

      case State::MacroName:
        if (c == '}') {
          auto e = ExpandMacro(result, macroNamespace, macroName,
                               macroExpanders, version);
          if (e != ExpandMacroResult::Ok) {
            return e;
          }
          macroNamespace.clear();
          macroName.clear();
          state = State::Default;
        } else {
          macroName += c;
        }
        break;
    }
  }

  switch (state) {
    case State::Default:
      break;
    case State::MacroNamespace:
      result += '$';
      result += macroNamespace;
      break;
    case State::MacroName:
      return ExpandMacroResult::Error;
  }

  out = std::move(result);
  return ExpandMacroResult::Ok;
}